

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

t_emit * __thiscall xemmai::t_emit::operator<<(t_emit *this,t_label *a_label)

{
  iterator __position;
  void *local_10;
  
  local_10 = (void *)((long)(this->v_code->v_instructions).
                            super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->v_code->v_instructions).
                            super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3);
  __position._M_current =
       (a_label->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (a_label->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&a_label->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,__position,
               (unsigned_long *)&local_10);
  }
  else {
    *__position._M_current = (unsigned_long)local_10;
    (a_label->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  local_10 = (void *)0x0;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&this->v_code->v_instructions,&local_10);
  return this;
}

Assistant:

t_emit& operator<<(t_label& a_label)
	{
		a_label.push_back(f_last());
		return *this << size_t(0);
	}